

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlabel.cpp
# Opt level: O0

void __thiscall QLabel::setNum(QLabel *this,double num)

{
  long lVar1;
  QString *in_RDI;
  long in_FS_OFFSET;
  double in_XMM0_Qa;
  QLabel *in_stack_ffffffffffffffe0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QString::number(in_XMM0_Qa,-0x20,0x67);
  setText(in_stack_ffffffffffffffe0,in_RDI);
  QString::~QString((QString *)0x5ae833);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QLabel::setNum(double num)
{
    setText(QString::number(num));
}